

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_ref_t flatcc_builder_end_buffer(flatcc_builder_t *B,flatcc_builder_ref_t root)

{
  ushort block_align;
  uint uVar1;
  __flatcc_builder_frame_t *p_Var2;
  flatcc_builder_ref_t fVar3;
  uint uVar4;
  
  if (B->frame->type == 1) {
    block_align = B->block_align;
    if (B->min_align < block_align) {
      B->min_align = block_align;
    }
    fVar3 = flatcc_builder_create_buffer
                      (B,(char *)&B->identifier,block_align,root,B->min_align,
                       (ushort)(B->nest_id != 0) | B->buffer_flags & 2);
    p_Var2 = B->frame;
    B->buffer_mark = (p_Var2->container).table.pl_end;
    B->nest_id = (p_Var2->container).buffer.nest_id;
    B->identifier = (p_Var2->container).table.vs_end;
    B->buffer_flags = (p_Var2->container).buffer.flags;
    B->block_align = (p_Var2->container).buffer.block_align;
    memset(B->ds,0,(ulong)B->ds_offset);
    p_Var2 = B->frame;
    B->ds_offset = p_Var2->ds_offset;
    uVar4 = p_Var2->ds_first;
    B->ds_first = uVar4;
    uVar1 = p_Var2->type_limit;
    B->ds = (uint8_t *)((ulong)uVar4 + (long)B->buffers[1].iov_base);
    uVar4 = (int)B->buffers[1].iov_len - uVar4;
    if (uVar1 <= uVar4) {
      uVar4 = uVar1;
    }
    B->ds_limit = uVar4;
    if (B->min_align < B->align) {
      B->min_align = B->align;
    }
    B->align = p_Var2->align;
    B->frame = p_Var2 + -1;
    B->level = B->level + -1;
    return fVar3;
  }
  __assert_fail("(B->frame[0].type) == flatcc_builder_buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x359,
                "flatcc_builder_ref_t flatcc_builder_end_buffer(flatcc_builder_t *, flatcc_builder_ref_t)"
               );
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_buffer(flatcc_builder_t *B, flatcc_builder_ref_t root)
{
    flatcc_builder_ref_t buffer_ref;
    flatcc_builder_buffer_flags_t flags;

    flags = (flatcc_builder_buffer_flags_t)B->buffer_flags & flatcc_builder_with_size;
    flags |= is_top_buffer(B) ? 0 : flatcc_builder_is_nested;
    check(frame(type) == flatcc_builder_buffer, "expected buffer frame");
    set_min_align(B, B->block_align);
    if (0 == (buffer_ref = flatcc_builder_create_buffer(B, (void *)&B->identifier,
            B->block_align, root, B->min_align, flags))) {
        return 0;
    }
    B->buffer_mark = frame(container.buffer.mark);
    B->nest_id = frame(container.buffer.nest_id);
    B->identifier = frame(container.buffer.identifier);
    B->buffer_flags = frame(container.buffer.flags);
    B->block_align = frame(container.buffer.block_align);

    exit_frame(B);
    return buffer_ref;
}